

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O2

Status * __thiscall
draco::Decoder::DecodeBufferToGeometry
          (Status *__return_storage_ptr__,Decoder *this,DecoderBuffer *in_buffer,Mesh *out_geometry)

{
  string *this_00;
  unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> this_01;
  Status *_local_status;
  DracoHeader header;
  StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
  _statusor122;
  DecoderBuffer temp_buffer;
  allocator<char> local_a5;
  DracoHeader local_a4;
  StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_> local_98;
  DecoderBuffer local_68;
  
  local_68.bit_mode_ = in_buffer->bit_mode_;
  local_68._49_1_ = in_buffer->field_0x31;
  local_68.bitstream_version_ = in_buffer->bitstream_version_;
  local_68._52_4_ = *(undefined4 *)&in_buffer->field_0x34;
  local_68.data_ = in_buffer->data_;
  local_68.data_size_ = in_buffer->data_size_;
  local_68.pos_ = in_buffer->pos_;
  local_68.bit_decoder_.bit_buffer_ = (in_buffer->bit_decoder_).bit_buffer_;
  local_68.bit_decoder_.bit_buffer_end_ = (in_buffer->bit_decoder_).bit_buffer_end_;
  local_68.bit_decoder_.bit_offset_ = (in_buffer->bit_decoder_).bit_offset_;
  PointCloudDecoder::DecodeHeader(__return_storage_ptr__,&local_68,&local_a4);
  if (__return_storage_ptr__->code_ == OK) {
    this_00 = &__return_storage_ptr__->error_msg_;
    std::__cxx11::string::~string((string *)this_00);
    if (local_a4.encoder_type == '\x01') {
      CreateMeshDecoder(&local_98,local_a4.encoder_method);
      this_01._M_t.
      super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
      super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
      super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>,_true,_true>
           )(__uniq_ptr_data<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>,_true,_true>
             )local_98.value_;
      if (local_98.status_.code_ == OK) {
        local_98.value_._M_t.
        super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
        super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
        super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>,_true,_true>
              )(__uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>)0x0;
        MeshDecoder::Decode(__return_storage_ptr__,
                            (MeshDecoder *)
                            this_01._M_t.
                            super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>
                            .super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl,
                            &this->options_,in_buffer,out_geometry);
        if (__return_storage_ptr__->code_ == OK) {
          std::__cxx11::string::~string((string *)this_00);
          __return_storage_ptr__->code_ = OK;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->error_msg_).field_2;
          (__return_storage_ptr__->error_msg_)._M_string_length = 0;
          (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
        }
        (*((PointCloudDecoder *)
          this_01._M_t.
          super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
          super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
          super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl)->_vptr_PointCloudDecoder
          [1])(this_01._M_t.
               super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>.
               _M_t.
               super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>
               .super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl);
      }
      else {
        Status::Status(__return_storage_ptr__,&local_98.status_);
      }
      StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
      ~StatusOr(&local_98);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Input is not a mesh.",&local_a5);
      __return_storage_ptr__->code_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)this_00,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  DecoderBuffer::BitDecoder::~BitDecoder(&local_68.bit_decoder_);
  return __return_storage_ptr__;
}

Assistant:

Status Decoder::DecodeBufferToGeometry(DecoderBuffer *in_buffer,
                                       Mesh *out_geometry) {
#ifdef DRACO_MESH_COMPRESSION_SUPPORTED
  DecoderBuffer temp_buffer(*in_buffer);
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(PointCloudDecoder::DecodeHeader(&temp_buffer, &header))
  if (header.encoder_type != TRIANGULAR_MESH) {
    return Status(Status::DRACO_ERROR, "Input is not a mesh.");
  }
  DRACO_ASSIGN_OR_RETURN(std::unique_ptr<MeshDecoder> decoder,
                         CreateMeshDecoder(header.encoder_method))

  DRACO_RETURN_IF_ERROR(decoder->Decode(options_, in_buffer, out_geometry))
  return OkStatus();
#else
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
#endif
}